

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

btVector3 __thiscall
btRigidBody::computeGyroscopicForceExplicit(btRigidBody *this,btScalar maxGyroscopicForce)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btVector3 bVar23;
  
  fVar16 = (this->m_invInertiaLocal).m_floats[0];
  fVar9 = (this->m_invInertiaLocal).m_floats[1];
  fVar10 = (this->m_invInertiaLocal).m_floats[2];
  fVar19 = (float)(-(uint)(fVar16 != 0.0) & (uint)(1.0 / fVar16));
  fVar17 = (float)(-(uint)(fVar9 != 0.0) & (uint)(1.0 / fVar9));
  fVar15 = (float)(-(uint)(fVar10 != 0.0) & (uint)(1.0 / fVar10));
  fVar16 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  fVar9 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  fVar10 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  fVar11 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fVar21 = fVar19 * fVar11;
  fVar1 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  fVar14 = fVar17 * fVar1;
  fVar2 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  fVar8 = fVar15 * fVar2;
  fVar3 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar4 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar5 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  fVar22 = fVar4 * fVar19;
  fVar19 = fVar16 * fVar19;
  fVar20 = fVar3 * fVar17;
  fVar17 = fVar9 * fVar17;
  fVar18 = fVar5 * fVar15;
  fVar15 = fVar10 * fVar15;
  fVar6 = (this->m_angularVelocity).m_floats[0];
  uVar7 = *(undefined8 *)((this->m_angularVelocity).m_floats + 1);
  fVar12 = (float)uVar7;
  fVar13 = (float)((ulong)uVar7 >> 0x20);
  fVar8 = (fVar8 * fVar5 + fVar21 * fVar4 + fVar14 * fVar3) * fVar13 +
          (fVar10 * fVar8 + fVar16 * fVar21 + fVar9 * fVar14) * fVar6 +
          (fVar2 * fVar8 + fVar11 * fVar21 + fVar1 * fVar14) * fVar12;
  fVar14 = fVar13 * (fVar5 * fVar18 + fVar4 * fVar22 + fVar3 * fVar20) +
           fVar6 * (fVar10 * fVar18 + fVar16 * fVar22 + fVar9 * fVar20) +
           fVar12 * (fVar2 * fVar18 + fVar11 * fVar22 + fVar1 * fVar20);
  fVar16 = fVar13 * (fVar5 * fVar15 + fVar4 * fVar19 + fVar3 * fVar17) +
           fVar6 * (fVar10 * fVar15 + fVar16 * fVar19 + fVar9 * fVar17) +
           fVar12 * (fVar2 * fVar15 + fVar11 * fVar19 + fVar1 * fVar17);
  fVar10 = fVar12 * fVar14 - fVar8 * fVar13;
  fVar11 = fVar13 * fVar16 - fVar14 * fVar6;
  fVar9 = fVar8 * fVar6 - fVar16 * fVar12;
  fVar16 = fVar9 * fVar9 + fVar10 * fVar10 + fVar11 * fVar11;
  if (maxGyroscopicForce * maxGyroscopicForce < fVar16) {
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    fVar16 = (1.0 / fVar16) * maxGyroscopicForce;
    fVar9 = fVar9 * fVar16;
    fVar10 = fVar10 * fVar16;
    fVar11 = fVar11 * fVar16;
  }
  bVar23.m_floats[1] = fVar11;
  bVar23.m_floats[0] = fVar10;
  bVar23.m_floats[2] = fVar9;
  bVar23.m_floats[3] = 0.0;
  return (btVector3)bVar23.m_floats;
}

Assistant:

btVector3 btRigidBody::computeGyroscopicForceExplicit(btScalar maxGyroscopicForce) const
{
	btVector3 inertiaLocal = getLocalInertia();
	btMatrix3x3 inertiaTensorWorld = getWorldTransform().getBasis().scaled(inertiaLocal) * getWorldTransform().getBasis().transpose();
	btVector3 tmp = inertiaTensorWorld*getAngularVelocity();
	btVector3 gf = getAngularVelocity().cross(tmp);
	btScalar l2 = gf.length2();
	if (l2>maxGyroscopicForce*maxGyroscopicForce)
	{
		gf *= btScalar(1.)/btSqrt(l2)*maxGyroscopicForce;
	}
	return gf;
}